

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O2

int mbedtls_ssl_set_client_transport_id(mbedtls_ssl_context *ssl,uchar *info,size_t ilen)

{
  int iVar1;
  uchar *__dest;
  
  iVar1 = -0x7100;
  if (ssl->conf->endpoint == '\x01') {
    free(ssl->cli_id);
    __dest = (uchar *)calloc(1,ilen);
    ssl->cli_id = __dest;
    if (__dest == (uchar *)0x0) {
      iVar1 = -0x7f00;
    }
    else {
      memcpy(__dest,info,ilen);
      ssl->cli_id_len = ilen;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_set_client_transport_id(mbedtls_ssl_context *ssl,
                                        const unsigned char *info,
                                        size_t ilen)
{
    if (ssl->conf->endpoint != MBEDTLS_SSL_IS_SERVER) {
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    mbedtls_free(ssl->cli_id);

    if ((ssl->cli_id = mbedtls_calloc(1, ilen)) == NULL) {
        return MBEDTLS_ERR_SSL_ALLOC_FAILED;
    }

    memcpy(ssl->cli_id, info, ilen);
    ssl->cli_id_len = ilen;

    return 0;
}